

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O2

void expand_2_vec(TCGContext_conflict9 *tcg_ctx,uint vece,uint32_t dofs,uint32_t aofs,uint32_t oprsz
                 ,uint32_t tysz,TCGType_conflict type,
                 _func_void_TCGContext_ptr_uint_TCGv_vec_TCGv_vec_conflict9 *fni)

{
  TCGv_vec r;
  uint uVar1;
  
  r = tcg_temp_new_vec_tricore(tcg_ctx,type);
  for (uVar1 = 0; uVar1 < oprsz; uVar1 = uVar1 + tysz) {
    tcg_gen_ld_vec_tricore(tcg_ctx,r,tcg_ctx->cpu_env,(ulong)(aofs + uVar1));
    (*fni)(tcg_ctx,vece,r,r);
    tcg_gen_st_vec_tricore(tcg_ctx,r,tcg_ctx->cpu_env,(ulong)(dofs + uVar1));
  }
  tcg_temp_free_internal_tricore(tcg_ctx,(TCGTemp *)(r + (long)tcg_ctx));
  return;
}

Assistant:

static void expand_2_vec(TCGContext *tcg_ctx, unsigned vece, uint32_t dofs, uint32_t aofs,
                         uint32_t oprsz, uint32_t tysz, TCGType type,
                         void (*fni)(TCGContext *, unsigned, TCGv_vec, TCGv_vec))
{
    TCGv_vec t0 = tcg_temp_new_vec(tcg_ctx, type);
    uint32_t i;

    for (i = 0; i < oprsz; i += tysz) {
        tcg_gen_ld_vec(tcg_ctx, t0, tcg_ctx->cpu_env, aofs + i);
        fni(tcg_ctx, vece, t0, t0);
        tcg_gen_st_vec(tcg_ctx, t0, tcg_ctx->cpu_env, dofs + i);
    }
    tcg_temp_free_vec(tcg_ctx, t0);
}